

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCAEngine.h
# Opt level: O2

void __thiscall
Js::SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
          (SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_> *this,
          void *src,uint *dst)

{
  ScriptContext *scriptContext;
  bool bVar1;
  SrcTypeId typeId;
  void *local_38;
  void *src_local;
  SCADeepCloneType deepClone;
  
  scriptContext =
       (this->m_cloner->
       super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
       ).super_ScriptContextHolder.m_scriptContext;
  local_38 = src;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(src);
  typeId = SerializationCloner<Js::StreamWriter>::GetTypeId(this->m_cloner,src);
  bVar1 = SerializationCloner<Js::StreamWriter>::TryClonePrimitive(this->m_cloner,typeId,src,dst);
  if (bVar1) {
    return;
  }
  bVar1 = TryGetClonedObject(this,src,dst);
  if (bVar1) {
    SerializationCloner<Js::StreamWriter>::CloneObjectReference(this->m_cloner,src,*dst);
    return;
  }
  bVar1 = SerializationCloner<Js::StreamWriter>::TryCloneObject
                    (this->m_cloner,typeId,src,dst,(SCADeepCloneType *)((long)&src_local + 4));
  if (!bVar1) {
    ScriptContextHolder::ThrowSCAUnsupported((ScriptContextHolder *)this->m_cloner);
  }
  JsUtil::
  BaseDictionary<void*,unsigned_int,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<void*,unsigned_int,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
            ((BaseDictionary<void*,unsigned_int,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)this->m_clonedObjects,&local_38,dst);
  switch(src_local._4_4_) {
  case 1:
    goto switchD_00d60d35_caseD_1;
  case 2:
    SerializationCloner<Js::StreamWriter>::CloneMap(this->m_cloner,local_38,*dst);
    break;
  case 3:
    SerializationCloner<Js::StreamWriter>::CloneSet(this->m_cloner,local_38,*dst);
    break;
  case 4:
    SerializationCloner<Js::StreamWriter>::CloneHostObjectProperties
              (this->m_cloner,typeId,local_38,*dst);
    return;
  default:
    return;
  }
  src_local._4_4_ = 1;
switchD_00d60d35_caseD_1:
  SerializationCloner<Js::StreamWriter>::CloneProperties(this->m_cloner,typeId,local_38,*dst);
  return;
}

Assistant:

void Clone(Src src, Dst* dst)
        {
            PROBE_STACK(m_cloner->GetScriptContext(), Constants::MinStackDefault);

#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Src>(src);
#endif

            typename Cloner::SrcTypeId typeId = m_cloner->GetTypeId(src);

            if (m_cloner->TryClonePrimitive(typeId, src, dst))
            {
                return;
            }

            if (Cloner::ShouldLookupReference() && TryGetClonedObject(src, dst))
            {
                m_cloner->CloneObjectReference(src, *dst);
                return;
            }

            SCADeepCloneType deepClone;
            if (m_cloner->TryCloneObject(typeId, src, dst, &deepClone))
            {
                m_clonedObjects->Add(src, *dst);

                if (deepClone == SCADeepCloneType::Map)
                {
                    m_cloner->CloneMap(src, *dst);
                    deepClone = SCADeepCloneType::Object;
                }
                else if (deepClone == SCADeepCloneType::Set)
                {
                    m_cloner->CloneSet(src, *dst);
                    deepClone = SCADeepCloneType::Object;
                }

                if (deepClone == SCADeepCloneType::HostObject)
                {
                    m_cloner->CloneHostObjectProperties(typeId, src, *dst);
                }
                else if (deepClone == SCADeepCloneType::Object)
                {
                    m_cloner->CloneProperties(typeId, src, *dst);
                }
                return;
            }

            // Unsupported src type, throw
            m_cloner->ThrowSCAUnsupported();
        }